

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * __thiscall amrex::BoxArray::surroundingNodes(BoxArray *this,int dir)

{
  IndexType IVar1;
  
  IVar1 = BATransformer::index_type(&this->m_bat);
  BATransformer::set_index_type(&this->m_bat,(IndexType)(IVar1.itype | 1 << (dir & 0x1fU)));
  return this;
}

Assistant:

BoxArray&
BoxArray::surroundingNodes (int dir)
{
    IndexType typ = ixType();
    typ.setType(dir, IndexType::NODE);
    return this->convert(typ);
}